

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O0

void connection(string *ip,uint port,bool *running_flag,RobotKuka *robotKuka)

{
  Pose move;
  Axes rotate;
  undefined2 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [8];
  undefined1 auVar5 [8];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int __fd;
  int iVar11;
  ssize_t sVar12;
  reference pvVar13;
  void *__buf;
  size_t __n;
  DigitalOutputs local_2f0;
  int send_status;
  string local_2b0 [33];
  DigitalOutputs local_28f;
  undefined1 auStack_28c [5];
  DigitalOutputs digout;
  Axes axis;
  undefined1 auStack_268 [8];
  Pose pose;
  string local_248 [8];
  string xml_receive;
  Data local_224;
  undefined1 local_140 [8];
  Data data;
  int length;
  char *xml_send;
  socklen_t sendsize;
  sockaddr_in clientaddr;
  sockaddr_in serveraddr;
  int fd;
  RobotKuka *robotKuka_local;
  bool *running_flag_local;
  uint port_local;
  string *ip_local;
  
  __fd = socket(2,2,0);
  if (__fd < 0) {
    perror("socket failed");
  }
  memset(clientaddr.sin_zero,0,0x10);
  clientaddr.sin_zero[0] = '\x02';
  clientaddr.sin_zero[1] = '\0';
  clientaddr.sin_zero._2_2_ = htons((uint16_t)port);
  clientaddr.sin_zero._4_4_ = htonl(0);
  xml_send._0_4_ = 0x10;
  memset((void *)((long)&xml_send + 4),0,0x10);
  iVar11 = bind(__fd,(sockaddr *)clientaddr.sin_zero,0x10);
  if (iVar11 < 0) {
    perror("bind failed");
  }
  do {
    if ((*running_flag & 1U) == 0) {
LAB_0010936d:
      close(__fd);
      pthread_exit((void *)0x0);
    }
    register0x00000000 = (char *)malloc(0x800);
    sVar12 = recvfrom(__fd,register0x00000000,0x800,0,(sockaddr *)((long)&xml_send + 4),
                      (socklen_t *)&xml_send);
    data.ftc.c = (float)sVar12;
    if ((int)data.ftc.c < 0) {
      perror("recvfrom failed");
      goto LAB_0010936d;
    }
    stack0xffffffffffffffa8[(int)data.ftc.c] = '\0';
    Data::Data((Data *)local_140);
    xml_handler::get_data_from_xml_send(&local_224,stack0xffffffffffffffa8,(int)data.ftc.c);
    memcpy((Data *)local_140,&local_224,0xe4);
    std::__cxx11::string::string(local_248);
    Pose::Pose((Pose *)auStack_268);
    Axes::Axes((Axes *)auStack_28c);
    DigitalOutputs::DigitalOutputs(&local_28f);
    bVar10 = std::queue<Pose,_std::deque<Pose,_std::allocator<Pose>_>_>::empty
                       (&robotKuka->move_queue);
    if (!bVar10) {
      pvVar13 = std::queue<Pose,_std::deque<Pose,_std::allocator<Pose>_>_>::front
                          (&robotKuka->move_queue);
      pose.z = pvVar13->b;
      pose.a = pvVar13->c;
      auStack_268._0_4_ = pvVar13->x;
      auStack_268._4_4_ = pvVar13->y;
      pose.x = pvVar13->z;
      pose.y = pvVar13->a;
      std::queue<Pose,_std::deque<Pose,_std::allocator<Pose>_>_>::pop(&robotKuka->move_queue);
    }
    uVar8 = pose._8_8_;
    uVar6 = pose._0_8_;
    auVar4 = auStack_268;
    uVar2 = _auStack_28c;
    bVar10 = local_28f.o3;
    uVar1 = local_28f._0_2_;
    Data::get_ipoc((Data *)local_140);
    uVar9 = pose._8_8_;
    uVar7 = pose._0_8_;
    auVar5 = auStack_268;
    uVar3 = _auStack_28c;
    local_2f0 = (DigitalOutputs)CONCAT12(bVar10,uVar1);
    pose.x = (float)uVar6;
    pose.y = SUB84(uVar6,4);
    move.z = pose.x;
    move.a = pose.y;
    auStack_268._0_4_ = auVar4._0_4_;
    auStack_268._4_4_ = auVar4._4_4_;
    move.x = (float)auStack_268._0_4_;
    move.y = (float)auStack_268._4_4_;
    pose.z = (float)uVar8;
    pose.a = SUB84(uVar8,4);
    move.b = pose.z;
    move.c = pose.a;
    rotate._8_8_ = axis._0_8_;
    auStack_28c._0_4_ = (undefined4)uVar2;
    stack0xfffffffffffffd78 = SUB84(uVar2,4);
    rotate.a1 = (float)auStack_28c._0_4_;
    rotate.a2 = stack0xfffffffffffffd78;
    rotate._16_8_ = axis._8_8_;
    _auStack_28c = uVar3;
    auStack_268 = auVar5;
    pose._0_8_ = uVar7;
    pose._8_8_ = uVar9;
    xml_handler::generate_xml_receive_abi_cxx11_
              (move,rotate,SUB83(local_2b0,0),CONCAT13(0,local_2f0));
    std::__cxx11::string::operator=(local_248,local_2b0);
    std::__cxx11::string::~string(local_2b0);
    __buf = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::length();
    sendto(__fd,__buf,__n,0,(sockaddr *)((long)&xml_send + 4),(socklen_t)xml_send);
    free(stack0xffffffffffffffa8);
    std::__cxx11::string::~string(local_248);
  } while( true );
}

Assistant:

void connection(std::string ip, unsigned int port, bool* running_flag, RobotKuka* robotKuka)
{	
	#define EXPR_SIZE   2048
	#define BUFLEN      2048
	#define TRUE        1
	#define SERVERLEN   2048

	int fd;

    if ((fd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
        perror( "socket failed" );
    }

    struct sockaddr_in serveraddr;
    memset( &serveraddr, 0, sizeof(serveraddr) );
    serveraddr.sin_family = AF_INET;
    serveraddr.sin_port = htons( port );
    serveraddr.sin_addr.s_addr = htonl( INADDR_ANY );

	struct sockaddr_in clientaddr;
    socklen_t sendsize = sizeof(clientaddr);
	bzero(&clientaddr, sizeof(clientaddr));


    if (bind(fd, (struct sockaddr *)&serveraddr, sizeof(serveraddr)) < 0) {
        perror( "bind failed" );
    }


	while (*running_flag)
	{
		char* xml_send = (char*)malloc(sizeof(char) * 2048);

		int length = recvfrom(fd, xml_send, sizeof(char) * 2048 , 0, (struct sockaddr *) &clientaddr, &sendsize );
        if ( length < 0 ) {
            perror( "recvfrom failed" );
            break;
        }

        /* Starts chrono to account CYCLE TIME */
		//auto started = std::chrono::high_resolution_clock::now();

		//std::cout << "Msg len: " << length << std::endl;

		xml_send[length] = '\0';  // This is necessary to avoid xml_parse errors;

		/* Gets all data read from received XML Send and puts it into a instance of Data. */
		Data data;
		data = xml_handler::get_data_from_xml_send(const_cast<char*>(xml_send), length);

		//data.get_r_ist().print();
		//std::cout << data.get_delay() << std::endl;

		//data.print();

		std::string xml_receive;  // creates string for XML Receive

		/* Creates void instances of pose, axis and digital outputs to send thru XML Receive. */
		Pose pose = Pose();
		Axes axis = Axes();
		DigitalOutputs digout = DigitalOutputs();

		/* Push one element from the queue if the movement queue is not empty. If the queue is empty,
		the void instances are placed. */
		if (!robotKuka->move_queue.empty())
		{
			pose = robotKuka->move_queue.front();
			robotKuka->move_queue.pop();
		}

		/* Generates the XML Receive string using the pose, axis, and digital outputs instances and
		the previous XML Send IPOC value. */
    	xml_receive = xml_handler::generate_xml_receive(pose, axis, digout, data.get_ipoc());

    	/* Sends the XML Receive string thru the socket created previously. */
		int send_status = sendto(fd, xml_receive.c_str(), xml_receive.length()*sizeof(char), 0, (struct sockaddr *) &clientaddr, 
								 sendsize);

		/* Free the allocated space for XML Send string. */
		free(xml_send);  // might be a bottleneck <!>

		/* Stops chrono to account CYCLE TIME. */
		//auto done = std::chrono::high_resolution_clock::now();
		//std::cout << "Time: " << std::chrono::duration_cast<std::chrono::nanoseconds>(done-started).count();
	}


	/* Closes the previously openned communication socket. */
    close(fd);

    /* Exits the previously created communication thread. */
	pthread_exit(NULL);
	exit(0);
}